

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

void __thiscall simple_thread_pool::ThreadPoolMgr::loop(ThreadPoolMgr *this)

{
  bool bVar1;
  pthread_t __target_thread;
  ThreadPoolMgr *in_RDI;
  shared_ptr<simple_thread_pool::TaskHandle> task_to_run;
  shared_ptr<simple_thread_pool::ThreadHandle> thread_to_assign;
  uint64_t next_sleep_us;
  element_type *in_stack_ffffffffffffff98;
  TaskHandle *in_stack_ffffffffffffffa8;
  __shared_ptr local_50 [8];
  shared_ptr<simple_thread_pool::TaskHandle> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffd8;
  EventAwaiter *in_stack_ffffffffffffffe0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  ThreadPoolMgr *this_00;
  
  this_00 = in_RDI;
  __target_thread = pthread_self();
  pthread_setname_np(__target_thread,"stp_coord");
  local_10 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI->MAX_SLEEP_US)->_M_pi;
  do {
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffffa8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(in_RDI->myOpt).busyWaitingIntervalUs <
        local_10) {
      EventAwaiter::wait_us(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_ffffffffffffffa8);
    if (bVar1) {
      return;
    }
    EventAwaiter::reset((EventAwaiter *)0x109023);
    local_10 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI->MAX_SLEEP_US)->_M_pi;
    std::shared_ptr<simple_thread_pool::ThreadHandle>::shared_ptr
              ((shared_ptr<simple_thread_pool::ThreadHandle> *)in_RDI,in_stack_ffffffffffffff98);
    if ((in_RDI->myOpt).numInitialThreads == 0) {
LAB_001090a5:
      (*(code *)(((__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2> *)
                 &in_RDI->super_ThreadPoolMgrBase)->_M_ptr->tHandle).
                super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                (local_50,in_RDI,&local_10);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_50);
      if (bVar1) {
        if ((in_RDI->myOpt).numInitialThreads == 0) {
          in_stack_ffffffffffffff98 =
               std::
               __shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x10914c);
          TaskResult::TaskResult((TaskResult *)&stack0xffffffffffffffac);
          TaskHandle::execute(in_stack_ffffffffffffffa8,(TaskResult *)in_RDI);
        }
        else {
          std::
          __shared_ptr_access<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x109131);
          ThreadHandle::assign
                    ((ThreadHandle *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
        }
        in_stack_ffffffffffffffc0 = 0;
      }
      else {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffe0);
        if (bVar1) {
          (*(code *)(((__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2> *)
                     &in_RDI->super_ThreadPoolMgrBase)->_M_ptr->myself).
                    super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)(in_RDI,&stack0xffffffffffffffe0);
        }
        in_stack_ffffffffffffffc0 = 2;
      }
      std::shared_ptr<simple_thread_pool::TaskHandle>::~shared_ptr
                ((shared_ptr<simple_thread_pool::TaskHandle> *)0x109180);
    }
    else {
      popThread(this_00);
      std::shared_ptr<simple_thread_pool::ThreadHandle>::operator=
                ((shared_ptr<simple_thread_pool::ThreadHandle> *)in_RDI,
                 (shared_ptr<simple_thread_pool::ThreadHandle> *)in_stack_ffffffffffffff98);
      std::shared_ptr<simple_thread_pool::ThreadHandle>::~shared_ptr
                ((shared_ptr<simple_thread_pool::ThreadHandle> *)0x109075);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffe0);
      if (bVar1) goto LAB_001090a5;
      in_stack_ffffffffffffffc0 = 2;
    }
    std::shared_ptr<simple_thread_pool::ThreadHandle>::~shared_ptr
              ((shared_ptr<simple_thread_pool::ThreadHandle> *)0x10918a);
  } while( true );
}

Assistant:

void loop() {
#ifdef __linux__
        pthread_setname_np(pthread_self(), "stp_coord");
#endif
        uint64_t next_sleep_us = MAX_SLEEP_US;

        while (!stopSignal) {
            if (next_sleep_us > myOpt.busyWaitingIntervalUs) {
                eaLoop.wait_us(next_sleep_us - myOpt.busyWaitingIntervalUs);
            } else {
                // Otherwise: busy waiting.
            }
            if (stopSignal) break;

            eaLoop.reset();
            next_sleep_us = MAX_SLEEP_US;

            std::shared_ptr<ThreadHandle> thread_to_assign = nullptr;

            if (myOpt.numInitialThreads) {
                // Thread pool exists, pick an idle thread.
                thread_to_assign = popThread();
                if (!thread_to_assign) {
                    // All threads are busy, skip.
                    continue;
                }
            }
            // Otherwise (empty thread pool),
            // this loop thread will do execution.

            // Check timer task first (higher priority).
            std::shared_ptr<TaskHandle> task_to_run = getTaskToRun(&next_sleep_us);

            if (!task_to_run) {
                // No task to run, skip.
                if (thread_to_assign) {
                    // Return the thread to idle list.
                    returnThread(thread_to_assign);
                }
                continue;
            }

            if (myOpt.numInitialThreads) {
                // Assign the task to picked thread.
                thread_to_assign->assign(task_to_run);
            } else {
                // Empty thread pool, execute here.
                task_to_run->execute(TaskResult());
            }
        }
    }